

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

char * GetInstructionName(VmInstruction *inst)

{
  VmInstructionType cmd;
  VmInstruction *inst_local;
  
  switch(inst->cmd) {
  case VM_INST_LOAD_BYTE:
    inst_local = (VmInstruction *)anon_var_dwarf_d4078;
    break;
  case VM_INST_LOAD_SHORT:
    inst_local = (VmInstruction *)anon_var_dwarf_d408f;
    break;
  case VM_INST_LOAD_INT:
    inst_local = (VmInstruction *)0x29fbb3;
    break;
  case VM_INST_LOAD_FLOAT:
    inst_local = (VmInstruction *)anon_var_dwarf_d40b1;
    break;
  case VM_INST_LOAD_DOUBLE:
    inst_local = (VmInstruction *)anon_var_dwarf_d40bc;
    break;
  case VM_INST_LOAD_LONG:
    inst_local = (VmInstruction *)anon_var_dwarf_d40c7;
    break;
  case VM_INST_LOAD_STRUCT:
    inst_local = (VmInstruction *)anon_var_dwarf_d40d2;
    break;
  case VM_INST_LOAD_IMMEDIATE:
    inst_local = (VmInstruction *)anon_var_dwarf_d40dd;
    break;
  case VM_INST_STORE_BYTE:
    inst_local = (VmInstruction *)anon_var_dwarf_d40f4;
    break;
  case VM_INST_STORE_SHORT:
    inst_local = (VmInstruction *)anon_var_dwarf_d410b;
    break;
  case VM_INST_STORE_INT:
    inst_local = (VmInstruction *)0x2b6009;
    break;
  case VM_INST_STORE_FLOAT:
    inst_local = (VmInstruction *)anon_var_dwarf_d4121;
    break;
  case VM_INST_STORE_DOUBLE:
    inst_local = (VmInstruction *)anon_var_dwarf_d412c;
    break;
  case VM_INST_STORE_LONG:
    inst_local = (VmInstruction *)anon_var_dwarf_d4137;
    break;
  case VM_INST_STORE_STRUCT:
    inst_local = (VmInstruction *)anon_var_dwarf_d4142;
    break;
  case VM_INST_DOUBLE_TO_INT:
    inst_local = (VmInstruction *)anon_var_dwarf_d414d;
    break;
  case VM_INST_DOUBLE_TO_LONG:
    inst_local = (VmInstruction *)anon_var_dwarf_d4164;
    break;
  case VM_INST_DOUBLE_TO_FLOAT:
    inst_local = (VmInstruction *)anon_var_dwarf_d416f;
    break;
  case VM_INST_INT_TO_DOUBLE:
    inst_local = (VmInstruction *)anon_var_dwarf_d417a;
    break;
  case VM_INST_LONG_TO_DOUBLE:
    inst_local = (VmInstruction *)anon_var_dwarf_d4185;
    break;
  case VM_INST_INT_TO_LONG:
    inst_local = (VmInstruction *)anon_var_dwarf_d4190;
    break;
  case VM_INST_LONG_TO_INT:
    inst_local = (VmInstruction *)anon_var_dwarf_d419b;
    break;
  case VM_INST_INDEX:
    inst_local = (VmInstruction *)0x2b6e4b;
    break;
  case VM_INST_INDEX_UNSIZED:
    inst_local = (VmInstruction *)anon_var_dwarf_d41b1;
    break;
  case VM_INST_FUNCTION_ADDRESS:
    inst_local = (VmInstruction *)anon_var_dwarf_d41bc;
    break;
  case VM_INST_TYPE_ID:
    inst_local = (VmInstruction *)0x2af29c;
    break;
  case VM_INST_SET_RANGE:
    inst_local = (VmInstruction *)anon_var_dwarf_d41d2;
    break;
  case VM_INST_MEM_COPY:
    inst_local = (VmInstruction *)anon_var_dwarf_d41e9;
    break;
  case VM_INST_JUMP:
    inst_local = (VmInstruction *)anon_var_dwarf_ac9ce;
    break;
  case VM_INST_JUMP_Z:
    inst_local = (VmInstruction *)anon_var_dwarf_d41ff;
    break;
  case VM_INST_JUMP_NZ:
    inst_local = (VmInstruction *)anon_var_dwarf_d420a;
    break;
  case VM_INST_CALL:
    inst_local = (VmInstruction *)0x2a8c34;
    break;
  case VM_INST_RETURN:
    inst_local = (VmInstruction *)0x2b5a61;
    break;
  case VM_INST_YIELD:
    inst_local = (VmInstruction *)0x2bdd57;
    break;
  case VM_INST_ADD:
    inst_local = (VmInstruction *)0x2bdc01;
    break;
  case VM_INST_SUB:
    inst_local = (VmInstruction *)anon_var_dwarf_aca82;
    break;
  case VM_INST_MUL:
    inst_local = (VmInstruction *)0x2b5474;
    break;
  case VM_INST_DIV:
    inst_local = (VmInstruction *)0x2b5479;
    break;
  case VM_INST_POW:
    inst_local = (VmInstruction *)anon_var_dwarf_d4262;
    break;
  case VM_INST_MOD:
    inst_local = (VmInstruction *)anon_var_dwarf_d426d;
    break;
  case VM_INST_LESS:
    inst_local = (VmInstruction *)0x2a5525;
    break;
  case VM_INST_GREATER:
    inst_local = (VmInstruction *)anon_var_dwarf_d428f;
    break;
  case VM_INST_LESS_EQUAL:
    inst_local = (VmInstruction *)anon_var_dwarf_d429a;
    break;
  case VM_INST_GREATER_EQUAL:
    inst_local = (VmInstruction *)anon_var_dwarf_d42a5;
    break;
  case VM_INST_EQUAL:
    inst_local = (VmInstruction *)0x2bdc9c;
    break;
  case VM_INST_NOT_EQUAL:
    inst_local = (VmInstruction *)anon_var_dwarf_d42bb;
    break;
  case VM_INST_SHL:
    inst_local = (VmInstruction *)anon_var_dwarf_acaac;
    break;
  case VM_INST_SHR:
    inst_local = (VmInstruction *)anon_var_dwarf_d42d1;
    break;
  case VM_INST_BIT_AND:
    inst_local = (VmInstruction *)0x2b5afa;
    break;
  case VM_INST_BIT_OR:
    inst_local = (VmInstruction *)0x29c6e8;
    break;
  case VM_INST_BIT_XOR:
    inst_local = (VmInstruction *)0x2c47e1;
    break;
  case VM_INST_ADD_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d42fd;
    break;
  case VM_INST_SUB_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4308;
    break;
  case VM_INST_MUL_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4313;
    break;
  case VM_INST_DIV_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d431e;
    break;
  case VM_INST_POW_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4329;
    break;
  case VM_INST_MOD_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4334;
    break;
  case VM_INST_LESS_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d433f;
    break;
  case VM_INST_GREATER_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d434a;
    break;
  case VM_INST_LESS_EQUAL_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4355;
    break;
  case VM_INST_GREATER_EQUAL_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4360;
    break;
  case VM_INST_EQUAL_LOAD:
    inst_local = (VmInstruction *)0x2bdcfc;
    break;
  case VM_INST_NOT_EQUAL_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4376;
    break;
  case VM_INST_SHL_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4381;
    break;
  case VM_INST_SHR_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d438c;
    break;
  case VM_INST_BIT_AND_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d4397;
    break;
  case VM_INST_BIT_OR_LOAD:
    inst_local = (VmInstruction *)0x2bdd20;
    break;
  case VM_INST_BIT_XOR_LOAD:
    inst_local = (VmInstruction *)anon_var_dwarf_d43ad;
    break;
  case VM_INST_NEG:
    inst_local = (VmInstruction *)anon_var_dwarf_aca64;
    break;
  case VM_INST_BIT_NOT:
    inst_local = (VmInstruction *)0x2c48c8;
    break;
  case VM_INST_LOG_NOT:
    inst_local = (VmInstruction *)anon_var_dwarf_d43ce;
    break;
  case VM_INST_CONVERT_POINTER:
    inst_local = (VmInstruction *)anon_var_dwarf_d43d9;
    break;
  case VM_INST_ABORT_NO_RETURN:
    inst_local = (VmInstruction *)anon_var_dwarf_d43e4;
    break;
  case VM_INST_CONSTRUCT:
    inst_local = (VmInstruction *)anon_var_dwarf_c35f5;
    break;
  case VM_INST_ARRAY:
    inst_local = (VmInstruction *)0x29ded9;
    break;
  case VM_INST_EXTRACT:
    inst_local = (VmInstruction *)anon_var_dwarf_d4411;
    break;
  case VM_INST_UNYIELD:
    inst_local = (VmInstruction *)anon_var_dwarf_d441c;
    break;
  case VM_INST_PHI:
    inst_local = (VmInstruction *)anon_var_dwarf_d4427;
    break;
  case VM_INST_BITCAST:
    inst_local = (VmInstruction *)anon_var_dwarf_d4432;
    break;
  case VM_INST_MOV:
    inst_local = (VmInstruction *)anon_var_dwarf_ac94a;
    break;
  case VM_INST_DEF:
    inst_local = (VmInstruction *)0x29a164;
    break;
  case VM_INST_PARALLEL_COPY:
    inst_local = (VmInstruction *)anon_var_dwarf_d4453;
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                  ,0x215,"const char *GetInstructionName(VmInstruction *)");
  }
  return (char *)inst_local;
}

Assistant:

const char* GetInstructionName(VmInstruction *inst)
{
	VmInstructionType cmd = inst->cmd;

	switch(cmd)
	{
	case VM_INST_LOAD_BYTE:
		return "loadb";
	case VM_INST_LOAD_SHORT:
		return "loadw";
	case VM_INST_LOAD_INT:
		return "load";
	case VM_INST_LOAD_FLOAT:
		return "loadf";
	case VM_INST_LOAD_DOUBLE:
		return "loadd";
	case VM_INST_LOAD_LONG:
		return "loadl";
	case VM_INST_LOAD_STRUCT:
		return "loads";
	case VM_INST_LOAD_IMMEDIATE:
		return "loadimm";
	case VM_INST_STORE_BYTE:
		return "storeb";
	case VM_INST_STORE_SHORT:
		return "storew";
	case VM_INST_STORE_INT:
		return "store";
	case VM_INST_STORE_FLOAT:
		return "storef";
	case VM_INST_STORE_DOUBLE:
		return "stored";
	case VM_INST_STORE_LONG:
		return "storel";
	case VM_INST_STORE_STRUCT:
		return "stores";
	case VM_INST_DOUBLE_TO_INT:
		return "dti";
	case VM_INST_DOUBLE_TO_LONG:
		return "dtl";
	case VM_INST_DOUBLE_TO_FLOAT:
		return "dtf";
	case VM_INST_INT_TO_DOUBLE:
		return "itd";
	case VM_INST_LONG_TO_DOUBLE:
		return "ltd";
	case VM_INST_INT_TO_LONG:
		return "itl";
	case VM_INST_LONG_TO_INT:
		return "lti";
	case VM_INST_INDEX:
		return "index";
	case VM_INST_INDEX_UNSIZED:
		return "indexu";
	case VM_INST_FUNCTION_ADDRESS:
		return "faddr";
	case VM_INST_TYPE_ID:
		return "typeid";
	case VM_INST_SET_RANGE:
		return "setrange";
	case VM_INST_MEM_COPY:
		return "memcopy";
	case VM_INST_JUMP:
		return "jmp";
	case VM_INST_JUMP_Z:
		return "jmpz";
	case VM_INST_JUMP_NZ:
		return "jmpnz";
	case VM_INST_CALL:
		return "call";
	case VM_INST_RETURN:
		return "ret";
	case VM_INST_YIELD:
		return "yield";
	case VM_INST_ADD:
		return "add";
	case VM_INST_SUB:
		return "sub";
	case VM_INST_MUL:
		return "mul";
	case VM_INST_DIV:
		return "div";
	case VM_INST_POW:
		return "pow";
	case VM_INST_MOD:
		return "mod";
	case VM_INST_LESS:
		return "lt";
	case VM_INST_GREATER:
		return "gt";
	case VM_INST_LESS_EQUAL:
		return "lte";
	case VM_INST_GREATER_EQUAL:
		return "gte";
	case VM_INST_EQUAL:
		return "eq";
	case VM_INST_NOT_EQUAL:
		return "neq";
	case VM_INST_SHL:
		return "shl";
	case VM_INST_SHR:
		return "shr";
	case VM_INST_BIT_AND:
		return "and";
	case VM_INST_BIT_OR:
		return "or";
	case VM_INST_BIT_XOR:
		return "xor";
	case VM_INST_ADD_LOAD:
		return "add_load";
	case VM_INST_SUB_LOAD:
		return "sub_load";
	case VM_INST_MUL_LOAD:
		return "mul_load";
	case VM_INST_DIV_LOAD:
		return "div_load";
	case VM_INST_POW_LOAD:
		return "pow_load";
	case VM_INST_MOD_LOAD:
		return "mod_load";
	case VM_INST_LESS_LOAD:
		return "lt_load";
	case VM_INST_GREATER_LOAD:
		return "gt_load";
	case VM_INST_LESS_EQUAL_LOAD:
		return "lte_load";
	case VM_INST_GREATER_EQUAL_LOAD:
		return "gte_load";
	case VM_INST_EQUAL_LOAD:
		return "eq_load";
	case VM_INST_NOT_EQUAL_LOAD:
		return "neq_load";
	case VM_INST_SHL_LOAD:
		return "shl_load";
	case VM_INST_SHR_LOAD:
		return "shr_load";
	case VM_INST_BIT_AND_LOAD:
		return "and_load";
	case VM_INST_BIT_OR_LOAD:
		return "or_load";
	case VM_INST_BIT_XOR_LOAD:
		return "xor_load";
	case VM_INST_NEG:
		return "neg";
	case VM_INST_BIT_NOT:
		return "not";
	case VM_INST_LOG_NOT:
		return "lnot";
	case VM_INST_CONVERT_POINTER:
		return "convert_pointer";
	case VM_INST_ABORT_NO_RETURN:
		return "abort_no_return";
	case VM_INST_CONSTRUCT:
		return "construct";
	case VM_INST_ARRAY:
		return "array";
	case VM_INST_EXTRACT:
		return "extract";
	case VM_INST_UNYIELD:
		return "unyield";
	case VM_INST_PHI:
		return "phi";
	case VM_INST_BITCAST:
		return "bitcast";
	case VM_INST_MOV:
		return "mov";
	case VM_INST_DEF:
		return "def";
	case VM_INST_PARALLEL_COPY:
		return "parallel_copy";
	default:
		assert(!"unknown instruction");
	}

	return "unknown";
}